

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt.c
# Opt level: O1

int get_tx_type_cost(MACROBLOCK *x,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,TX_TYPE tx_type,
                    int reduced_tx_set_used)

{
  uint uVar1;
  bool bVar2;
  PREDICTION_MODE *pPVar3;
  MB_MODE_INFO *pMVar4;
  byte bVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  byte bVar10;
  int *piVar5;
  
  if (0 < plane) {
    return 0;
  }
  uVar7 = (ulong)tx_size;
  pMVar4 = *xd->mi;
  uVar9 = 1;
  if (-1 < (char)*(ushort *)&pMVar4->field_0xa7) {
    uVar9 = (ulong)('\0' < pMVar4->ref_frame[0]);
  }
  iVar8 = (int)uVar9;
  bVar6 = (byte)uVar9;
  if ((0x61810UL >> (uVar7 & 0x3f) & 1) == 0) {
    bVar10 = bVar6;
    if (((0x18608UL >> (uVar7 & 0x3f) & 1) == 0) && (bVar10 = 1, reduced_tx_set_used == 0)) {
      bVar10 = av1_ext_tx_set_lookup[0]
               [(ulong)((0x60604UL >> (uVar7 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar8 * 2)];
    }
  }
  else {
    bVar10 = 0;
  }
  if (bVar10 == 0) {
    return 0;
  }
  if (xd->lossless[*(ushort *)&pMVar4->field_0xa7 & 7] != 0) {
    return 0;
  }
  if ((0x61810UL >> (tx_size & 0x3f) & 1) == 0) {
    if ((0x18608UL >> (uVar7 & 0x3f) & 1) == 0) {
      if (reduced_tx_set_used == 0) {
        bVar6 = av1_ext_tx_set_lookup[0]
                [(ulong)((0x60604UL >> (uVar7 & 0x3f) & 1) != 0) + (ulong)(uint)(iVar8 * 2)];
      }
      else {
        bVar6 = (iVar8 == 0) + 1;
      }
    }
  }
  else {
    bVar6 = 0;
  }
  uVar1 = ext_tx_set_index[uVar9][bVar6];
  if (iVar8 == 0) {
    if (0 < (int)uVar1) {
      if ((pMVar4->filter_intra_mode_info).use_filter_intra == '\0') {
        pPVar3 = &pMVar4->mode;
      }
      else {
        pPVar3 = "" + (pMVar4->filter_intra_mode_info).filter_intra_mode;
      }
      piVar5 = (x->mode_costs).intra_tx_type_costs[uVar1][""[uVar7]][*pPVar3] + tx_type;
      goto LAB_002452be;
    }
  }
  else if (0 < (int)uVar1) {
    piVar5 = (x->mode_costs).inter_tx_type_costs[uVar1][""[uVar7]] + tx_type;
LAB_002452be:
    pMVar4 = (MB_MODE_INFO *)(ulong)(uint)*piVar5;
    bVar2 = false;
    goto LAB_002452c2;
  }
  bVar2 = true;
LAB_002452c2:
  if (bVar2) {
    return 0;
  }
  return (int)pMVar4;
}

Assistant:

static int get_tx_type_cost(const MACROBLOCK *x, const MACROBLOCKD *xd,
                            int plane, TX_SIZE tx_size, TX_TYPE tx_type,
                            int reduced_tx_set_used) {
  if (plane > 0) return 0;

  const TX_SIZE square_tx_size = txsize_sqr_map[tx_size];

  const MB_MODE_INFO *mbmi = xd->mi[0];
  const int is_inter = is_inter_block(mbmi);
  if (get_ext_tx_types(tx_size, is_inter, reduced_tx_set_used) > 1 &&
      !xd->lossless[xd->mi[0]->segment_id]) {
    const int ext_tx_set =
        get_ext_tx_set(tx_size, is_inter, reduced_tx_set_used);
    if (is_inter) {
      if (ext_tx_set > 0)
        return x->mode_costs
            .inter_tx_type_costs[ext_tx_set][square_tx_size][tx_type];
    } else {
      if (ext_tx_set > 0) {
        PREDICTION_MODE intra_dir;
        if (mbmi->filter_intra_mode_info.use_filter_intra)
          intra_dir = fimode_to_intradir[mbmi->filter_intra_mode_info
                                             .filter_intra_mode];
        else
          intra_dir = mbmi->mode;
        return x->mode_costs.intra_tx_type_costs[ext_tx_set][square_tx_size]
                                                [intra_dir][tx_type];
      }
    }
  }
  return 0;
}